

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfontstash.h
# Opt level: O3

int glfonsRasterize(FONScontext *ctx,fsuint textId,char *s,uint color)

{
  undefined8 uVar1;
  uint uVar2;
  GLFONScontext *pGVar3;
  FONSshaping *pFVar4;
  mapped_type pGVar5;
  GLFONSbuffer *pGVar6;
  size_t sVar7;
  mapped_type *ppGVar8;
  short sVar9;
  pointer pfVar10;
  size_t sVar11;
  int iVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  fsuint local_4c;
  GLFONScontext *local_48;
  mapped_type local_40;
  value_type_conflict1 local_34;
  
  pGVar3 = (GLFONScontext *)(ctx->params).userPtr;
  local_4c = textId;
  pGVar6 = glfons__bufferBound(pGVar3);
  fVar14 = fonsDrawText(ctx,0.0,0.0,s,(char *)0x0,'\0');
  if ((int)fVar14 == -1) {
    iVar12 = 1;
  }
  else {
    local_40 = (mapped_type)operator_new(0x20);
    uVar13 = (long)(pGVar6->interleavedArray).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pGVar6->interleavedArray).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_40->offset = (long)uVar13 >> 2;
    iVar12 = (int)(uVar13 >> 2);
    local_34 = 0.0;
    local_48 = pGVar3;
    std::vector<float,_std::allocator<float>_>::resize
              (&pGVar6->interleavedArray,
               (long)ctx->nverts * (pGVar3->layout).nbComponents + (long)iVar12,&local_34);
    pGVar5 = local_40;
    pGVar3 = local_48;
    uVar2 = ctx->nverts;
    if ((int)uVar2 < 1) {
      fVar15 = INFINITY;
      fVar16 = INFINITY;
      fVar17 = -INFINITY;
      fVar18 = -INFINITY;
    }
    else {
      pfVar10 = (pGVar6->interleavedArray).super__Vector_base<float,_std::allocator<float>_>._M_impl
                .super__Vector_impl_data._M_start + (long)iVar12 + 3;
      fVar15 = INFINITY;
      fVar16 = INFINITY;
      fVar17 = -INFINITY;
      fVar18 = -INFINITY;
      uVar13 = 0;
      do {
        uVar1 = *(undefined8 *)(ctx->verts + uVar13);
        fVar19 = (float)uVar1;
        fVar20 = (float)((ulong)uVar1 >> 0x20);
        *(undefined8 *)(pfVar10 + -3) = uVar1;
        fVar15 = (float)(~-(uint)(fVar19 < fVar15) & (uint)fVar15 |
                        (uint)fVar19 & -(uint)(fVar19 < fVar15));
        fVar16 = (float)(~-(uint)(fVar20 < fVar16) & (uint)fVar16 |
                        (uint)fVar20 & -(uint)(fVar20 < fVar16));
        fVar17 = (float)(~-(uint)(fVar17 < fVar19) & (uint)fVar17 |
                        (uint)fVar19 & -(uint)(fVar17 < fVar19));
        fVar18 = (float)(~-(uint)(fVar18 < fVar20) & (uint)fVar18 |
                        (uint)fVar20 & -(uint)(fVar18 < fVar20));
        pfVar10[-1] = ctx->tcoords[uVar13];
        *pfVar10 = ctx->tcoords[uVar13 + 1];
        uVar13 = uVar13 + 2;
        pfVar10 = pfVar10 + 8;
      } while (uVar13 < (ulong)uVar2 * 2);
      fVar15 = fVar15 + 3.0;
      fVar16 = fVar16 + -3.0;
      fVar17 = fVar17 + 3.0;
      fVar18 = fVar18 + -3.0;
    }
    local_40->bbox[0] = fVar15;
    local_40->bbox[1] = fVar16;
    local_40->bbox[2] = fVar17;
    local_40->bbox[3] = fVar18;
    local_40->length = (float)((int)fVar14 + -6);
    pFVar4 = ctx->shaping;
    if ((pFVar4 == (FONSshaping *)0x0) ||
       (iVar12 = ctx->nstates, ctx->states[(long)iVar12 + -1].useShaping == 0)) {
      sVar7 = strlen(s);
      if (sVar7 == 0) {
        sVar9 = 0;
      }
      else {
        sVar11 = 0;
        sVar9 = 0;
        uVar13 = 0;
        do {
          uVar13 = (ulong)(byte)fons__decutf8(unsigned_int*,unsigned_int*,unsigned_int)::utf8d
                                [(byte)fons__decutf8(unsigned_int*,unsigned_int*,unsigned_int)::
                                       utf8d[(byte)s[sVar11]] + uVar13 + 0x100];
          sVar9 = sVar9 + (ushort)(uVar13 == 0);
          sVar11 = sVar11 + 1;
        } while (sVar7 != sVar11);
      }
      pGVar5->nbGlyph = sVar9;
    }
    else {
      sVar9 = (short)pFVar4->result->glyphCount;
      local_40->nbGlyph = sVar9;
      pFVar4->it = -1;
      ctx->states[(long)iVar12 + -1].useShaping = 0;
    }
    pGVar5->padding = sVar9 * (short)(int)(pGVar3->layout).nbComponents * 6;
    pGVar6->nVerts = pGVar6->nVerts + uVar2;
    ctx->nverts = 0;
    ppGVar8 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSstash_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSstash_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSstash_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSstash_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&pGVar6->stashes,&local_4c);
    *ppGVar8 = pGVar5;
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int glfonsRasterize(FONScontext* ctx, fsuint textId, const char* s, unsigned int color) {
    (void) color;
    GLFONScontext* gl = (GLFONScontext*) ctx->params.userPtr;
    GLFONSbuffer* buffer = glfons__bufferBound(gl);

    int length = fonsDrawText(ctx, 0, 0, s, NULL, 0);

    if (length == -1.f) {
        return GLFONS_INVALID;
    }

    GLFONSstash* stash = new GLFONSstash;

    stash->offset = buffer->interleavedArray.size();

    // pre-allocate data for this text id
    int oldSize = buffer->interleavedArray.size();
    buffer->interleavedArray.resize(oldSize + gl->layout.nbComponents * ctx->nverts, 0);

    float inf = std::numeric_limits<float>::infinity();
    float x0 = inf, x1 = -inf, y0 = inf, y1 = -inf;

    for(int i = 0, index = oldSize; i < ctx->nverts * 2; i += 2) {
        float x, y;

        x = ctx->verts[i];
        y = ctx->verts[i + 1];

        x0 = x < x0 ? x : x0;
        x1 = x > x1 ? x : x1;
        y0 = y < y0 ? y : y0;
        y1 = y > y1 ? y : y1;

        buffer->interleavedArray[index++] = x;
        buffer->interleavedArray[index++] = y;
        buffer->interleavedArray[index++] = ctx->tcoords[i];
        buffer->interleavedArray[index++] = ctx->tcoords[i + 1];
        index += 4; // skip screenPos / alpha / rotation
    }

    // remove extra-offset used for interpolation in fontstash
    stash->bbox[0] = x0 + 3;
    stash->bbox[1] = y0 - 3;
    stash->bbox[2] = x1 + 3;
    stash->bbox[3] = y1 - 3;

    stash->length = length - 6;

    if(ctx->shaping != NULL && fons__getState(ctx)->useShaping) {
        FONSshapingRes* res = ctx->shaping->result;
        stash->nbGlyph = res->glyphCount;
        fons__clearShaping(ctx);
    } else {
        const char* str = s;
        const char* end = s + strlen(s);
        int i = 0;
        unsigned int utf8state = 0;
        unsigned int codepoint = 0;

        // count glyphs
        for (; str != end; ++str) {
            if (fons__decutf8(&utf8state, &codepoint, *(const unsigned char*)str))
                continue;
            i++;
        }
        stash->nbGlyph = i;
    }

    stash->padding = stash->nbGlyph * GLYPH_VERTS * gl->layout.nbComponents;

    // hack : reset fontstash state
    buffer->nVerts += ctx->nverts;
    ctx->nverts = 0;

    buffer->stashes[textId] = stash;

    return GLFONS_VALID;
}